

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fIntegerStateQueryTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::IntegerStateQueryVerifiers::GetInteger64Verifier::verifyStencilMaskInitial
          (GetInteger64Verifier *this,TestContext *testCtx,GLenum name,int stencilBits)

{
  ostringstream *this_00;
  bool bVar1;
  StateQueryMemoryWriteGuard<long> state;
  StateQueryMemoryWriteGuard<long> local_1b8;
  undefined1 local_1a0 [120];
  ios_base local_128 [264];
  
  local_1b8.m_postguard = -0x2121212121212122;
  local_1b8.m_preguard = -0x2121212121212122;
  local_1b8.m_value = 0xdededededededede;
  glu::CallLogWrapper::glGetInteger64v
            (&(this->super_StateVerifier).super_CallLogWrapper,name,&local_1b8.m_value);
  bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<long>::verifyValidity
                    (&local_1b8,testCtx);
  if ((bVar1) && ((local_1b8.m_value | -1L << ((byte)stencilBits & 0x3f)) != 0xffffffffffffffff)) {
    local_1a0._0_8_ = testCtx->m_log;
    this_00 = (ostringstream *)(local_1a0 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"// ERROR: expected mimimum mask of ",0x23);
    std::ostream::_M_insert<long>((long)this_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"; got ",6);
    std::ostream::_M_insert<long>((long)this_00);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base(local_128);
    if (testCtx->m_testResult == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"Got invalid mask value");
    }
  }
  return;
}

Assistant:

void GetInteger64Verifier::verifyStencilMaskInitial (tcu::TestContext& testCtx, GLenum name, int stencilBits)
{
	using tcu::TestLog;

	StateQueryMemoryWriteGuard<GLint64> state;
	glGetInteger64v(name, &state);

	if (!state.verifyValidity(testCtx))
		return;

	const GLint64 reference = (1ULL << stencilBits) - 1;

	if ((state & reference) != reference) // the least significant stencilBits bits should be on
	{
		testCtx.getLog() << TestLog::Message << "// ERROR: expected mimimum mask of " << reference << "; got " << state << TestLog::EndMessage;
		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid mask value");
	}
}